

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_copy_map_iterator_to_different_map(void **param_1)

{
  bool bVar1;
  unsigned_long b;
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  Roaring64Map m2;
  Roaring64MapSetBitBiDirectionalIterator it;
  Roaring64Map m1;
  Roaring64MapSetBitBiDirectionalIterator local_58;
  
  m2.roarings._M_t._M_impl._0_8_ = 1;
  l._M_len = 1;
  l._M_array = (iterator)&m2;
  roaring::Roaring64Map::Roaring64Map(&m1,l);
  it.i.parent = (roaring_bitmap_t *)0x1e;
  it.i.container = (container_s *)0x28;
  it.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          *)0xa;
  it.map_iter._M_node = (_Base_ptr)0x14;
  l_00._M_len = 4;
  l_00._M_array = (iterator)&it;
  roaring::Roaring64Map::Roaring64Map(&m2,l_00);
  roaring::Roaring64Map::begin(&it,&m1);
  roaring::Roaring64Map::begin(&local_58,&m2);
  it.i.current_value = local_58.i.current_value;
  it.i.has_value = local_58.i.has_value;
  it.i._37_3_ = local_58.i._37_3_;
  it.i.typecode = local_58.i.typecode;
  it.i._17_3_ = local_58.i._17_3_;
  it.i.container_index = local_58.i.container_index;
  it.i.highbits = local_58.i.highbits;
  it.i.container_it.index = local_58.i.container_it.index;
  it.i.parent = local_58.i.parent;
  it.i.container = local_58.i.container;
  it.p = local_58.p;
  it.map_iter._M_node = local_58.map_iter._M_node;
  local_58.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)0x15;
  roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger(&it,(value_type *)&local_58);
  b = 0;
  while( true ) {
    roaring::Roaring64Map::end(&local_58,&m2);
    bVar1 = roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=(&it,&local_58);
    if (!bVar1) break;
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&it);
    b = b + 1;
  }
  _assert_int_equal(2,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x870);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&m2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&m1);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_copy_map_iterator_to_different_map) {
    Roaring64Map m1{1};
    Roaring64Map m2{10, 20, 30, 40};
    auto it = m1.begin();
    it = m2.begin();
    it.move_equalorlarger(21);
    int n = 0;
    for (; it != m2.end(); ++it, ++n) {
    }
    assert_int_equal(2, n);
}